

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O3

bool __thiscall
bssl::ssl_parse_extensions
          (bssl *this,CBS *cbs,uint8_t *out_alert,initializer_list<bssl::SSLExtension_*> extensions,
          bool ignore_unknown)

{
  long lVar1;
  ushort *puVar2;
  undefined1 uVar3;
  int iVar4;
  iterator ppSVar5;
  long lVar6;
  uint16_t type;
  CBS copy;
  CBS data;
  ushort local_5a;
  CBS local_58;
  CBS *local_48;
  CBS local_40;
  
  ppSVar5 = extensions._M_array;
  if (ppSVar5 != (iterator)0x0) {
    lVar6 = 0;
    do {
      lVar1 = *(long *)(out_alert + lVar6);
      *(undefined1 *)(lVar1 + 3) = 0;
      *(undefined8 *)(lVar1 + 8) = 0;
      *(undefined8 *)(lVar1 + 0x10) = 0;
      if (*(char *)(lVar1 + 2) == '\0' && (char)extensions._M_len == '\x01') {
        __assert_fail("!ignore_unknown",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xb5,
                      "bool bssl::ssl_parse_extensions(const CBS *, uint8_t *, std::initializer_list<SSLExtension *>, bool)"
                     );
      }
      lVar6 = lVar6 + 8;
    } while ((long)ppSVar5 * 8 - lVar6 != 0);
  }
  local_58.data = *(uint8_t **)this;
  local_58.len = *(size_t *)(this + 8);
  if (local_58.len != 0) {
    local_48 = cbs;
    do {
      iVar4 = CBS_get_u16(&local_58,&local_5a);
      if ((iVar4 == 0) || (iVar4 = CBS_get_u16_length_prefixed(&local_58,&local_40), iVar4 == 0)) {
        ERR_put_error(0x10,0,0xbe,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xbf);
        uVar3 = 0x32;
LAB_001435d7:
        *(undefined1 *)&local_48->data = uVar3;
        return false;
      }
      if (ppSVar5 != (iterator)0x0) {
        lVar6 = 0;
        do {
          puVar2 = *(ushort **)(out_alert + lVar6);
          if ((local_5a == *puVar2) && ((char)puVar2[1] != '\0')) {
            if (*(char *)((long)puVar2 + 3) != '\x01') {
              *(undefined1 *)((long)puVar2 + 3) = 1;
              *(uint8_t **)(puVar2 + 4) = local_40.data;
              *(size_t *)(puVar2 + 8) = local_40.len;
              goto LAB_00143551;
            }
            ERR_put_error(0x10,0,0x101,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0xd8);
            uVar3 = 0x2f;
            goto LAB_001435d7;
          }
          lVar6 = lVar6 + 8;
        } while ((long)ppSVar5 * 8 - lVar6 != 0);
      }
      if ((char)extensions._M_len == '\0') {
        ERR_put_error(0x10,0,0xde,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xd0);
        ERR_add_error_dataf("extension %u",(ulong)local_5a);
        uVar3 = 0x6e;
        goto LAB_001435d7;
      }
LAB_00143551:
    } while (local_58.len != 0);
  }
  return true;
}

Assistant:

bool ssl_parse_extensions(const CBS *cbs, uint8_t *out_alert,
                          std::initializer_list<SSLExtension *> extensions,
                          bool ignore_unknown) {
  // Reset everything.
  for (SSLExtension *ext : extensions) {
    ext->present = false;
    CBS_init(&ext->data, nullptr, 0);
    if (!ext->allowed) {
      assert(!ignore_unknown);
    }
  }

  CBS copy = *cbs;
  while (CBS_len(&copy) != 0) {
    uint16_t type;
    CBS data;
    if (!CBS_get_u16(&copy, &type) ||
        !CBS_get_u16_length_prefixed(&copy, &data)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PARSE_TLSEXT);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    SSLExtension *found = nullptr;
    for (SSLExtension *ext : extensions) {
      if (type == ext->type && ext->allowed) {
        found = ext;
        break;
      }
    }

    if (found == nullptr) {
      if (ignore_unknown) {
        continue;
      }
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", unsigned{type});
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    // Duplicate ext_types are forbidden.
    if (found->present) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_EXTENSION);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    found->present = true;
    found->data = data;
  }

  return true;
}